

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O2

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::circle
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,float r,bool fill,color *c)

{
  ImDrawList *this_00;
  ImU32 IVar1;
  undefined7 in_register_00000031;
  float fVar2;
  ImVec2 local_28;
  ImVec4 local_20;
  
  this_00 = this->draw_list;
  local_28.x = x;
  local_28.y = y;
  if ((int)CONCAT71(in_register_00000031,fill) == 0) {
    local_20.x = *c->r;
    local_20.y = *c->g;
    local_20.z = *c->b;
    local_20.w = *c->a;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_20);
    fVar2 = 250.0;
    if (r <= 250.0) {
      fVar2 = r;
    }
    ImDrawList::AddCircle(this_00,&local_28,r,IVar1,(int)fVar2,1.0);
  }
  else {
    local_20.x = *c->r;
    local_20.y = *c->g;
    local_20.z = *c->b;
    local_20.w = *c->a;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_20);
    fVar2 = 250.0;
    if (r <= 250.0) {
      fVar2 = r;
    }
    ImDrawList::AddCircleFilled(this_00,&local_28,r,IVar1,(int)fVar2);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::circle(float x, float y, float r, bool fill,
                                          const color::color& c) {
    if (fill) {
        draw_list->AddCircleFilled(ImVec2(x, y), r, ImColor(c.r, c.g, c.b, c.a),
                                   std::min(r, 250.f));
    } else {
        draw_list->AddCircle(ImVec2(x, y), r, ImColor(c.r, c.g, c.b, c.a),
                             std::min(r, 250.f));
    }
}